

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Table.h
# Opt level: O2

void __thiscall Table::Table(Table *this)

{
  this->current_row = 1;
  this->current_col = 1;
  this->table[0][0] = '1';
  this->table[0][1] = '3';
  this->table[0][2] = '6';
  this->table[1][0] = '4';
  this->table[1][1] = ' ';
  this->table[1][2] = '2';
  this->table[2][0] = '7';
  this->table[2][1] = '5';
  this->table[2][2].number = '8';
  return;
}

Assistant:

Table() {
        table[0][0] = Cell('1');
        table[0][1] = Cell('3');
        table[0][2] = Cell('6');
        table[1][0] = Cell('4');
        table[1][1] = Cell(' ');
        table[1][2] = Cell('2');
        table[2][0] = Cell('7');
        table[2][1] = Cell('5');
        table[2][2] = Cell('8');
    }